

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_set_cost_upd_freq(AV1_COMP *cpi,ThreadData *td,TileInfo *tile_info,int mi_row,int mi_col)

{
  int iVar1;
  nmv_context *nmvc;
  int in_ECX;
  TileInfo *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  FRAME_CONTEXT *unaff_retaddr;
  ModeCosts *in_stack_00000008;
  AV1_COMMON *in_stack_00000010;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  int num_planes;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar2;
  uint uVar3;
  uint usehp;
  uint integer_mv;
  
  av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
  nmvc = (nmv_context *)(in_RSI + 0x1a0);
  if ((*(byte *)(in_RDI + 0x3c16c) & 1) == 0) {
    integer_mv = *(uint *)(in_RDI + 0x60b04);
    if (((1 < integer_mv) && (integer_mv - 2 < 3)) &&
       (iVar1 = skip_cost_update(*(SequenceHeader **)(in_RDI + 0x42008),in_RDX,in_ECX,in_R8D,
                                 *(INTERNAL_COST_UPDATE_TYPE *)(in_RDI + 0x60b04)), iVar1 == 0)) {
      av1_fill_coeff_costs((CoeffCosts *)cpi,(FRAME_CONTEXT *)td,tile_info._4_4_);
    }
    usehp = *(uint *)(in_RDI + 0x60b08);
    if (((1 < usehp) && (usehp - 2 < 3)) &&
       (iVar1 = skip_cost_update(*(SequenceHeader **)(in_RDI + 0x42008),in_RDX,in_ECX,in_R8D,
                                 *(INTERNAL_COST_UPDATE_TYPE *)(in_RDI + 0x60b08)), iVar1 == 0)) {
      av1_fill_mode_rates(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    }
    uVar3 = *(uint *)(in_RDI + 0x60b00);
    if (((1 < uVar3) && (uVar3 - 2 < 3)) &&
       (iVar1 = skip_mv_cost_update((AV1_COMP *)CONCAT44(integer_mv,usehp),
                                    (TileInfo *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                                    in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8), iVar1 == 0
       )) {
      av1_fill_mv_costs(nmvc,integer_mv,usehp,(MvCosts *)CONCAT44(uVar3,in_stack_ffffffffffffffb0));
    }
    uVar2 = *(uint *)(in_RDI + 0x60ba8);
    if (((1 < uVar2) && (uVar2 - 2 < 3)) &&
       (iVar1 = skip_dv_cost_update((AV1_COMP *)CONCAT44(integer_mv,usehp),
                                    (TileInfo *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffffac,
                                    in_stack_ffffffffffffffa8), iVar1 == 0)) {
      av1_fill_dv_costs((nmv_context *)CONCAT44(uVar3,uVar2),
                        (IntraBCMVCosts *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
  }
  return;
}

Assistant:

void av1_set_cost_upd_freq(AV1_COMP *cpi, ThreadData *td,
                           const TileInfo *const tile_info, const int mi_row,
                           const int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;

  if (cm->features.disable_cdf_update) {
    return;
  }

  switch (cpi->sf.inter_sf.coeff_cost_upd_level) {
    case INTERNAL_COST_UPD_OFF:
    case INTERNAL_COST_UPD_TILE:  // Tile level
      break;
    case INTERNAL_COST_UPD_SBROW_SET:  // SB row set level in tile
    case INTERNAL_COST_UPD_SBROW:      // SB row level in tile
    case INTERNAL_COST_UPD_SB:         // SB level
      if (skip_cost_update(cm->seq_params, tile_info, mi_row, mi_col,
                           cpi->sf.inter_sf.coeff_cost_upd_level))
        break;
      av1_fill_coeff_costs(&x->coeff_costs, xd->tile_ctx, num_planes);
      break;
    default: assert(0);
  }

  switch (cpi->sf.inter_sf.mode_cost_upd_level) {
    case INTERNAL_COST_UPD_OFF:
    case INTERNAL_COST_UPD_TILE:  // Tile level
      break;
    case INTERNAL_COST_UPD_SBROW_SET:  // SB row set level in tile
    case INTERNAL_COST_UPD_SBROW:      // SB row level in tile
    case INTERNAL_COST_UPD_SB:         // SB level
      if (skip_cost_update(cm->seq_params, tile_info, mi_row, mi_col,
                           cpi->sf.inter_sf.mode_cost_upd_level))
        break;
      av1_fill_mode_rates(cm, &x->mode_costs, xd->tile_ctx);
      break;
    default: assert(0);
  }

  switch (cpi->sf.inter_sf.mv_cost_upd_level) {
    case INTERNAL_COST_UPD_OFF:
    case INTERNAL_COST_UPD_TILE:  // Tile level
      break;
    case INTERNAL_COST_UPD_SBROW_SET:  // SB row set level in tile
    case INTERNAL_COST_UPD_SBROW:      // SB row level in tile
    case INTERNAL_COST_UPD_SB:         // SB level
      // Checks for skip status of mv cost update.
      if (skip_mv_cost_update(cpi, tile_info, mi_row, mi_col)) break;
      av1_fill_mv_costs(&xd->tile_ctx->nmvc,
                        cm->features.cur_frame_force_integer_mv,
                        cm->features.allow_high_precision_mv, x->mv_costs);
      break;
    default: assert(0);
  }

  switch (cpi->sf.intra_sf.dv_cost_upd_level) {
    case INTERNAL_COST_UPD_OFF:
    case INTERNAL_COST_UPD_TILE:  // Tile level
      break;
    case INTERNAL_COST_UPD_SBROW_SET:  // SB row set level in tile
    case INTERNAL_COST_UPD_SBROW:      // SB row level in tile
    case INTERNAL_COST_UPD_SB:         // SB level
      // Checks for skip status of dv cost update.
      if (skip_dv_cost_update(cpi, tile_info, mi_row, mi_col)) break;
      av1_fill_dv_costs(&xd->tile_ctx->ndvc, x->dv_costs);
      break;
    default: assert(0);
  }
}